

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
          (SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *this,Base *other
          )

{
  bool bVar1;
  move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*> last;
  move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*> this_00;
  IntervalMap<unsigned_long,_std::monostate,_3U> *pIVar2;
  unsigned_long uVar3;
  move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*> in_RSI;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *in_RDI;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_stack_ffffffffffffff98;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *in_stack_ffffffffffffffa0
  ;
  
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::SmallVectorBase(in_RDI);
  bVar1 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::isSmall
                    ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                     in_RSI._M_current);
  if (bVar1) {
    in_RDI->cap = 2;
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::begin
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
               in_RSI._M_current);
    last = std::make_move_iterator<slang::IntervalMap<unsigned_long,std::monostate,3u>*>
                     (in_stack_ffffffffffffff98);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::end
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
               in_RSI._M_current);
    this_00 = std::make_move_iterator<slang::IntervalMap<unsigned_long,std::monostate,3u>*>
                        (in_stack_ffffffffffffff98);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::
    append<std::move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*>_>
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
               this_00._M_current,in_RSI,last);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::clear
              (in_stack_ffffffffffffffa0);
  }
  else {
    pIVar2 = std::exchange<slang::IntervalMap<unsigned_long,std::monostate,3u>*,decltype(nullptr)>
                       (&in_stack_ffffffffffffffa0->data_,(void **)in_stack_ffffffffffffff98);
    in_RDI->data_ = pIVar2;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->len = uVar3;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->cap = uVar3;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }